

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::OpenPopupEx(ImGuiID id)

{
  ImGuiWindow **ppIVar1;
  int iVar2;
  int iVar3;
  ImGuiPopupData *pIVar4;
  ulong uVar5;
  ulong uVar6;
  ImGuiContext *pIVar7;
  ImVec2 *pIVar8;
  undefined1 auVar9 [64];
  ImGuiPopupData local_58;
  undefined1 extraout_var [56];
  
  pIVar7 = GImGui;
  iVar2 = (GImGui->BeginPopupStack).Size;
  local_58.OpenMousePos.x = 0.0;
  local_58.OpenMousePos.y = 0.0;
  local_58.Window = (ImGuiWindow *)0x0;
  local_58.SourceWindow = GImGui->NavWindow;
  iVar3 = GImGui->FrameCount;
  local_58.OpenParentId =
       (GImGui->CurrentWindow->IDStack).Data[(long)(GImGui->CurrentWindow->IDStack).Size + -1];
  local_58.PopupId = id;
  local_58.OpenFrameCount = iVar3;
  auVar9._0_8_ = NavCalcPreferredRefPos();
  auVar9._8_56_ = extraout_var;
  local_58.OpenPopupPos = (ImVec2)vmovlps_avx(auVar9._0_16_);
  uVar5 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),ZEXT416((uint)(pIVar7->IO).MousePos.x),2);
  uVar6 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),ZEXT416((uint)(pIVar7->IO).MousePos.y),2);
  pIVar8 = &(pIVar7->IO).MousePos;
  if ((uVar5 & uVar6 & 1) == 0) {
    pIVar8 = &local_58.OpenPopupPos;
  }
  local_58.OpenMousePos = *pIVar8;
  if (iVar2 < (pIVar7->OpenPopupStack).Size) {
    pIVar4 = (pIVar7->OpenPopupStack).Data;
    if ((pIVar4[iVar2].PopupId == id) && (pIVar4[iVar2].OpenFrameCount == iVar3 + -1)) {
      pIVar4[iVar2].OpenFrameCount = iVar3;
    }
    else {
      ImVector<ImGuiPopupData>::resize(&pIVar7->OpenPopupStack,iVar2 + 1);
      pIVar4 = (pIVar7->OpenPopupStack).Data;
      ppIVar1 = &pIVar4[iVar2].SourceWindow;
      *ppIVar1 = local_58.SourceWindow;
      ppIVar1[1] = (ImGuiWindow *)CONCAT44(local_58.OpenParentId,local_58.OpenFrameCount);
      *(ImVec2 *)(ppIVar1 + 2) = local_58.OpenPopupPos;
      *(ImVec2 *)(ppIVar1 + 3) = local_58.OpenMousePos;
      pIVar4 = pIVar4 + iVar2;
      *(ulong *)pIVar4 = CONCAT44(local_58._4_4_,local_58.PopupId);
      pIVar4->Window = local_58.Window;
      pIVar4->SourceWindow = local_58.SourceWindow;
      pIVar4->OpenFrameCount = local_58.OpenFrameCount;
      pIVar4->OpenParentId = local_58.OpenParentId;
    }
  }
  else {
    ImVector<ImGuiPopupData>::push_back(&pIVar7->OpenPopupStack,&local_58);
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.BeginPopupStack.Size;
    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    //IMGUI_DEBUG_LOG("OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            g.OpenPopupStack.resize(current_stack_size + 1);
            g.OpenPopupStack[current_stack_size] = popup_ref;
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}